

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  HandleTable *this_00;
  uint32_t *puVar2;
  size_t sVar3;
  LRUHandle *pLVar4;
  bool bVar5;
  uint32_t hash;
  uint uVar6;
  int iVar7;
  uint uVar8;
  LRUHandle *pLVar9;
  LRUHandle **ppLVar10;
  undefined8 uVar11;
  long lVar12;
  Mutex *__mutex;
  LRUCache *this_01;
  long in_FS_OFFSET;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hash = Hash(key->data_,key->size_,0);
  uVar6 = hash >> 0x1c;
  __mutex = &this->shard_[uVar6].mutex_;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar7 == 0) {
    this_01 = this->shard_ + uVar6;
    sVar3 = key->size_;
    pLVar9 = (LRUHandle *)malloc(sVar3 + 0x47);
    pLVar9->value = value;
    pLVar9->deleter = deleter;
    pLVar9->charge = charge;
    pLVar9->key_length = sVar3;
    pLVar9->hash = hash;
    pLVar9->in_cache = false;
    pLVar9->refs = 1;
    lVar12 = 0;
    if (0x43 < sVar3 + 0x47) {
      lVar12 = sVar3 + 3;
    }
    __memcpy_chk(pLVar9->key_data,key->data_,sVar3,lVar12);
    if (this_01->capacity_ == 0) {
      pLVar9->next = (LRUHandle *)0x0;
    }
    else {
      pLVar9->refs = 2;
      pLVar9->in_cache = true;
      pLVar9->next = &this->shard_[uVar6].in_use_;
      pLVar4 = this->shard_[uVar6].in_use_.prev;
      pLVar9->prev = pLVar4;
      pLVar4->next = pLVar9;
      pLVar4 = pLVar9->next;
      pLVar4->prev = pLVar9;
      psVar1 = &this->shard_[uVar6].usage_;
      *psVar1 = *psVar1 + charge;
      if (pLVar4 == pLVar9) {
LAB_00684bdf:
        __assert_fail("next != this",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
      }
      this_00 = &this->shard_[uVar6].table_;
      local_48.data_ = pLVar9->key_data;
      local_48.size_ = sVar3;
      ppLVar10 = HandleTable::FindPointer(this_00,&local_48,hash);
      pLVar4 = *ppLVar10;
      if (pLVar4 == (LRUHandle *)0x0) {
        pLVar9->next_hash = (LRUHandle *)0x0;
        *ppLVar10 = pLVar9;
        uVar8 = this->shard_[uVar6].table_.elems_ + 1;
        this->shard_[uVar6].table_.elems_ = uVar8;
        if (this->shard_[uVar6].table_.length_ < uVar8) {
          HandleTable::Resize(this_00);
        }
      }
      else {
        pLVar9->next_hash = pLVar4->next_hash;
        *ppLVar10 = pLVar9;
      }
      LRUCache::FinishErase(this_01,pLVar4);
    }
    while ((this_01->capacity_ < this->shard_[uVar6].usage_ &&
           (pLVar4 = this->shard_[uVar6].lru_.next, pLVar4 != &this->shard_[uVar6].lru_))) {
      if (pLVar4->refs != 1) {
        __assert_fail("old->refs == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x127,
                      "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                     );
      }
      if (pLVar4->next == pLVar4) goto LAB_00684bdf;
      local_48.data_ = pLVar4->key_data;
      local_48.size_ = pLVar4->key_length;
      ppLVar10 = HandleTable::FindPointer(&this->shard_[uVar6].table_,&local_48,pLVar4->hash);
      pLVar4 = *ppLVar10;
      if (pLVar4 != (LRUHandle *)0x0) {
        *ppLVar10 = pLVar4->next_hash;
        puVar2 = &this->shard_[uVar6].table_.elems_;
        *puVar2 = *puVar2 - 1;
      }
      bVar5 = LRUCache::FinishErase(this_01,pLVar4);
      if (!bVar5) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x12a,
                      "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                     );
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (Handle *)pLVar9;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar11 = std::__throw_system_error(iVar7);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar11);
    }
  }
  __stack_chk_fail();
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }